

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::TabItemLabelAndCloseButton
               (ImDrawList *draw_list,ImRect *bb,ImGuiTabItemFlags flags,ImVec2 frame_padding,
               char *label,ImGuiID tab_id,ImGuiID close_button_id)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  ImVec2 IVar3;
  bool bVar4;
  ImGuiID IVar5;
  ImGuiItemStatusFlags IVar6;
  ImGuiContext *pIVar7;
  bool bVar8;
  bool bVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  ImVec2 frame_padding_local;
  ImVec2 local_88;
  ImVec2 local_80;
  ImVec2 label_size;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 IStack_60;
  ImVec2 local_58;
  ImVec2 IStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pIVar7 = GImGui;
  bVar8 = false;
  frame_padding_local = frame_padding;
  label_size = CalcTextSize(label,(char *)0x0,true,-1.0);
  fVar11 = (bb->Min).x;
  fVar10 = (bb->Max).x;
  if (1.0 < fVar10 - fVar11) {
    fVar11 = fVar11 + frame_padding_local.x;
    fVar12 = (bb->Min).y + frame_padding_local.y;
    fVar10 = fVar10 - frame_padding_local.x;
    fVar1 = (bb->Max).y;
    if ((flags & 1U) != 0) {
      local_48 = CONCAT44(fVar12,fVar11);
      uStack_40 = 0;
      IVar3 = CalcTextSize("*",(char *)0x0,false,-1.0);
      fVar10 = fVar10 - IVar3.x;
      local_68.x = (bb->Min).x + frame_padding_local.x + label_size.x + 2.0;
      if (fVar10 <= local_68.x) {
        local_68.x = fVar10;
      }
      local_68.y = frame_padding_local.y + (bb->Min).y + (float)(int)(pIVar7->FontSize * -0.25);
      local_88.y = (bb->Max).y - frame_padding_local.y;
      local_88.x = (bb->Max).x - frame_padding_local.x;
      local_70.x = 0.0;
      local_70.y = 0.0;
      RenderTextClippedEx(draw_list,&local_68,&local_88,"*",(char *)0x0,(ImVec2 *)0x0,&local_70,
                          (ImRect *)0x0);
      fVar11 = (float)local_48;
      fVar12 = local_48._4_4_;
    }
    local_88.y = fVar12;
    local_88.x = fVar11;
    if ((close_button_id == 0) ||
       ((pIVar7->HoveredId != close_button_id && pIVar7->HoveredId != tab_id &&
        (pIVar7->ActiveId != close_button_id)))) {
      bVar4 = false;
    }
    else {
      bVar4 = true;
    }
    local_80.x = fVar10;
    local_80.y = fVar1;
    if (bVar4) {
      pIVar2 = GImGui->CurrentWindow;
      local_68 = (pIVar2->DC).LastItemRect.Min;
      IStack_60 = (pIVar2->DC).LastItemRect.Max;
      local_58 = (pIVar2->DC).LastItemDisplayRect.Min;
      IStack_50 = (pIVar2->DC).LastItemDisplayRect.Max;
      fVar11 = pIVar7->FontSize;
      IVar5 = (pIVar2->DC).LastItemId;
      IVar6 = (pIVar2->DC).LastItemStatusFlags;
      PushStyleVar(10,&frame_padding_local);
      local_70.y = (bb->Min).y;
      local_70.x = ((bb->Max).x - (frame_padding_local.x + frame_padding_local.x)) - fVar11;
      bVar8 = CloseButton(close_button_id,&local_70);
      PopStyleVar(1);
      pIVar2 = GImGui->CurrentWindow;
      (pIVar2->DC).LastItemId = IVar5;
      (pIVar2->DC).LastItemStatusFlags = IVar6;
      (pIVar2->DC).LastItemRect.Min = local_68;
      (pIVar2->DC).LastItemRect.Max = IStack_60;
      (pIVar2->DC).LastItemDisplayRect.Min = local_58;
      (pIVar2->DC).LastItemDisplayRect.Max = IStack_50;
      if ((flags & 4U) == 0) {
        bVar9 = IsMouseClicked(2,false);
        bVar8 = bVar8 || bVar9;
      }
      fVar10 = fVar10 - fVar11;
    }
    else {
      bVar8 = false;
    }
    fVar11 = fVar10;
    if (!bVar4) {
      fVar11 = (bb->Max).x + -1.0;
    }
    RenderTextEllipsis(draw_list,&local_88,&local_80,fVar10,fVar11,label,(char *)0x0,&label_size);
  }
  return bVar8;
}

Assistant:

bool ImGui::TabItemLabelAndCloseButton(ImDrawList* draw_list, const ImRect& bb, ImGuiTabItemFlags flags, ImVec2 frame_padding, const char* label, ImGuiID tab_id, ImGuiID close_button_id)
{
    ImGuiContext& g = *GImGui;
    ImVec2 label_size = CalcTextSize(label, NULL, true);
    if (bb.GetWidth() <= 1.0f)
        return false;

    // Render text label (with clipping + alpha gradient) + unsaved marker
    const char* TAB_UNSAVED_MARKER = "*";
    ImRect text_pixel_clip_bb(bb.Min.x + frame_padding.x, bb.Min.y + frame_padding.y, bb.Max.x - frame_padding.x, bb.Max.y);
    if (flags & ImGuiTabItemFlags_UnsavedDocument)
    {
        text_pixel_clip_bb.Max.x -= CalcTextSize(TAB_UNSAVED_MARKER, NULL, false).x;
        ImVec2 unsaved_marker_pos(ImMin(bb.Min.x + frame_padding.x + label_size.x + 2, text_pixel_clip_bb.Max.x), bb.Min.y + frame_padding.y + IM_FLOOR(-g.FontSize * 0.25f));
        RenderTextClippedEx(draw_list, unsaved_marker_pos, bb.Max - frame_padding, TAB_UNSAVED_MARKER, NULL, NULL);
    }
    ImRect text_ellipsis_clip_bb = text_pixel_clip_bb;

    // Close Button
    // We are relying on a subtle and confusing distinction between 'hovered' and 'g.HoveredId' which happens because we are using ImGuiButtonFlags_AllowOverlapMode + SetItemAllowOverlap()
    //  'hovered' will be true when hovering the Tab but NOT when hovering the close button
    //  'g.HoveredId==id' will be true when hovering the Tab including when hovering the close button
    //  'g.ActiveId==close_button_id' will be true when we are holding on the close button, in which case both hovered booleans are false
    bool close_button_pressed = false;
    bool close_button_visible = false;
    if (close_button_id != 0)
        if (g.HoveredId == tab_id || g.HoveredId == close_button_id || g.ActiveId == close_button_id)
            close_button_visible = true;
    if (close_button_visible)
    {
        ImGuiItemHoveredDataBackup last_item_backup;
        const float close_button_sz = g.FontSize;
        PushStyleVar(ImGuiStyleVar_FramePadding, frame_padding);
        if (CloseButton(close_button_id, ImVec2(bb.Max.x - frame_padding.x * 2.0f - close_button_sz, bb.Min.y)))
            close_button_pressed = true;
        PopStyleVar();
        last_item_backup.Restore();

        // Close with middle mouse button
        if (!(flags & ImGuiTabItemFlags_NoCloseWithMiddleMouseButton) && IsMouseClicked(2))
            close_button_pressed = true;

        text_pixel_clip_bb.Max.x -= close_button_sz;
    }

    float ellipsis_max_x = close_button_visible ? text_pixel_clip_bb.Max.x : bb.Max.x - 1.0f;
    RenderTextEllipsis(draw_list, text_ellipsis_clip_bb.Min, text_ellipsis_clip_bb.Max, text_pixel_clip_bb.Max.x, ellipsis_max_x, label, NULL, &label_size);

    return close_button_pressed;
}